

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_layout.cpp
# Opt level: O3

spv_result_t spvtools::val::ModuleLayoutPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  ModuleLayoutSection MVar4;
  DiagnosticStream *pDVar5;
  long lVar6;
  Op opcode;
  char *pcVar7;
  char *local_200;
  DiagnosticStream local_1f8;
  
  uVar1 = (inst->inst_).opcode;
  opcode = (Op)uVar1;
  MVar4 = ValidationState_t::current_layout_section(_);
  if (kLayoutTypes < MVar4) {
    if (1 < MVar4 - kLayoutFunctionDeclarations) {
      return SPV_SUCCESS;
    }
    local_1f8.error_ = anon_unknown_3::FunctionScopedInstructions(_,inst,opcode);
    goto joined_r0x0063e78e;
  }
  if ((opcode != OpExtInstWithForwardRefsKHR) && (opcode != OpExtInst)) goto LAB_0063e815;
  bVar3 = spvExtInstIsDebugInfo((inst->inst_).ext_inst_type);
  if (bVar3) {
    uVar2 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[4];
    if ((inst->inst_).ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
      if (((uVar2 < 0x1e) && ((0x31800000U >> (uVar2 & 0x1f) & 1) != 0)) ||
         ((uVar2 - 0x65 < 4 && (uVar2 - 0x65 != 1)))) goto LAB_0063e805;
LAB_0063e943:
      MVar4 = ValidationState_t::current_layout_section(_);
      if ((10 < (int)MVar4) &&
         (MVar4 = ValidationState_t::current_layout_section(_), (int)MVar4 < 0xc))
      goto LAB_0063e815;
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_LAYOUT,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,"Debug info extension instructions other than ",0x2d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,"DebugScope, DebugNoScope, DebugDeclare, DebugValue ",0x33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,"must appear between section 9 (types, constants, ",0x31);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,"global variables) and section 10 (function ",0x2b);
      pcVar7 = "declarations)";
      lVar6 = 0xd;
    }
    else {
      if ((0x1d < uVar2) || ((0x31800000U >> (uVar2 & 0x1f) & 1) == 0)) goto LAB_0063e943;
LAB_0063e805:
      bVar3 = ValidationState_t::in_function_body(_);
      if (bVar3) goto LAB_0063e815;
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_LAYOUT,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,"DebugScope, DebugNoScope, DebugDeclare, DebugValue ",0x33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,"of debug info extension must appear in a function ",0x32);
      pcVar7 = "body";
      lVar6 = 4;
    }
LAB_0063e9d5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,pcVar7,lVar6);
  }
  else {
    bVar3 = spvExtInstIsNonSemantic((inst->inst_).ext_inst_type);
    MVar4 = ValidationState_t::current_layout_section(_);
    if (bVar3) {
      if ((int)MVar4 < 0xb) {
        ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_LAYOUT,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f8,"Non-semantic OpExtInst must not appear before types ",0x34
                  );
        pcVar7 = "section";
        lVar6 = 7;
        goto LAB_0063e9d5;
      }
LAB_0063e815:
      do {
        while( true ) {
          bVar3 = ValidationState_t::IsOpcodeInCurrentLayoutSection(_,opcode);
          if (bVar3) {
            return SPV_SUCCESS;
          }
          bVar3 = ValidationState_t::IsOpcodeInPreviousLayoutSection(_,opcode);
          if (bVar3) {
            ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_LAYOUT,inst);
            local_200 = spvOpcodeString(opcode);
            pDVar5 = DiagnosticStream::operator<<(&local_1f8,&local_200);
            pcVar7 = " is in an invalid layout section";
            lVar6 = 0x20;
            goto LAB_0063e930;
          }
          ValidationState_t::ProgressToNextLayoutSectionOrder(_);
          MVar4 = ValidationState_t::current_layout_section(_);
          if (MVar4 == kLayoutMemoryModel) break;
          if (MVar4 == kLayoutFunctionDeclarations) {
            local_1f8.error_ = ModuleLayoutPass(_,inst);
            goto joined_r0x0063e78e;
          }
        }
      } while (uVar1 == 0xe);
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_LAYOUT,inst);
      local_200 = spvOpcodeString(opcode);
      pDVar5 = DiagnosticStream::operator<<(&local_1f8,&local_200);
      pcVar7 = " cannot appear before the memory model instruction";
      lVar6 = 0x32;
    }
    else {
      if (0xc < (int)MVar4) goto LAB_0063e815;
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_LAYOUT,inst);
      local_200 = spvOpcodeString(opcode);
      pDVar5 = DiagnosticStream::operator<<(&local_1f8,&local_200);
      pcVar7 = " must appear in a block";
      lVar6 = 0x17;
    }
LAB_0063e930:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5,pcVar7,lVar6);
    local_1f8.error_ = pDVar5->error_;
  }
  DiagnosticStream::~DiagnosticStream(&local_1f8);
joined_r0x0063e78e:
  if (local_1f8.error_ == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return local_1f8.error_;
}

Assistant:

spv_result_t ModuleLayoutPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();

  switch (_.current_layout_section()) {
    case kLayoutCapabilities:
    case kLayoutExtensions:
    case kLayoutExtInstImport:
    case kLayoutMemoryModel:
    case kLayoutSamplerImageAddressMode:
    case kLayoutEntryPoint:
    case kLayoutExecutionMode:
    case kLayoutDebug1:
    case kLayoutDebug2:
    case kLayoutDebug3:
    case kLayoutAnnotations:
    case kLayoutTypes:
      if (auto error = ModuleScopedInstructions(_, inst, opcode)) return error;
      break;
    case kLayoutFunctionDeclarations:
    case kLayoutFunctionDefinitions:
      if (auto error = FunctionScopedInstructions(_, inst, opcode)) {
        return error;
      }
      break;
  }
  return SPV_SUCCESS;
}